

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_false>_>_>
::_reduce_by_F(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_false>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInF,Index currentIndex)

{
  ID_index IVar1;
  uint uVar2;
  Characteristic CVar3;
  pointer pIVar4;
  Column_settings *pCVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  iterator __position;
  Column_support *pCVar9;
  long *plVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar11;
  Field_element coef;
  uint local_4c;
  uint local_48;
  Index local_44;
  Column_settings *local_40;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_38;
  
  pIVar4 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  IVar1 = pIVar4[currentIndex].super_Chain_column_option.pivot_;
  if (IVar1 == 0xffffffff) {
LAB_001612ac:
    uVar6 = 0;
  }
  else {
    pCVar9 = &pIVar4[currentIndex].column_;
    do {
      pCVar9 = *(Column_support **)&(pCVar9->super_type).data_.root_plus_size_;
      if (pCVar9 == &pIVar4[currentIndex].column_) goto LAB_001612ac;
    } while (*(ID_index *)(pCVar9 + 1) != IVar1);
    uVar6 = *(uint *)((long)(pCVar9 + -1) + 0xc);
  }
  pCVar5 = this->colSettings_;
  uVar2 = (pCVar5->operators).characteristic_;
  if (uVar2 <= uVar6) {
    uVar6 = uVar6 % uVar2;
  }
  local_4c = (pCVar5->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
  CVar3 = (pCVar5->operators).characteristic_;
  local_44 = currentIndex;
  local_38 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInF;
  lVar8 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  local_40 = pCVar5;
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&pCVar5->operators,&local_4c,CVar3 - *(int *)(lVar8 + 0x24));
  uVar6 = local_4c;
  plVar10 = *(long **)&pIVar4[currentIndex].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)plVar10 != &pIVar4[currentIndex].column_) {
    pCVar5 = this->colSettings_;
    do {
      local_48 = *(uint *)(plVar10 + 2);
      pVar11 = std::
               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                         ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                           *)column,&local_48,(uint *)((long)plVar10 + -4));
      __position._M_node = (_Base_ptr)pVar11.first._M_node;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar7 = *(uint *)((long)plVar10 + -4) * uVar6 + *(int *)&__position._M_node[1].field_0x4;
        uVar2 = (pCVar5->operators).characteristic_;
        if (uVar2 <= uVar7) {
          uVar7 = uVar7 % uVar2;
        }
        *(uint *)&__position._M_node[1].field_0x4 = uVar7;
        if (uVar7 == 0) {
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,__position);
        }
      }
      else {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (&pCVar5->operators,(Element *)&__position._M_node[1].field_0x4,uVar6);
      }
      plVar10 = (long *)*plVar10;
    } while ((Column_support *)plVar10 != &pIVar4[currentIndex].column_);
  }
  local_48 = (local_40->operators).characteristic_ - local_4c;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int>(local_38,&local_44,&local_48);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_F(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInF,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);  // Reduce with the column col_g
    chainsInF.push_back(currentIndex);
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);  // Reduce with the column col_g
    chainsInF.emplace_back(currentIndex, operators.get_characteristic() - coef);
  }
}